

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O0

deBool qpXmlWriter_writeStringElement(qpXmlWriter *writer,char *elementName,char *elementContent)

{
  deBool dVar1;
  char *elementContent_local;
  char *elementName_local;
  qpXmlWriter *writer_local;
  
  dVar1 = qpXmlWriter_startElement(writer,elementName,0,(qpXmlAttribute *)0x0);
  if ((dVar1 != 0) &&
     (((elementContent == (char *)0x0 ||
       (dVar1 = qpXmlWriter_writeString(writer,elementContent), dVar1 != 0)) &&
      (dVar1 = qpXmlWriter_endElement(writer,elementName), dVar1 != 0)))) {
    return 1;
  }
  return 0;
}

Assistant:

deBool qpXmlWriter_writeStringElement (qpXmlWriter* writer, const char* elementName, const char* elementContent)
{
	if (!qpXmlWriter_startElement(writer, elementName, 0, DE_NULL) ||
		(elementContent && !qpXmlWriter_writeString(writer, elementContent)) ||
		!qpXmlWriter_endElement(writer, elementName))
		return DE_FALSE;

	return DE_TRUE;
}